

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_pedersen_commit
              (secp256k1_context *ctx,secp256k1_pedersen_commitment *commit,uchar *blind,
              uint64_t value,secp256k1_generator *gen)

{
  int iVar1;
  uint local_190;
  int local_18c;
  int ret;
  int overflow;
  secp256k1_scalar sec;
  secp256k1_ge r;
  secp256k1_gej rj;
  secp256k1_ge genp;
  secp256k1_generator *gen_local;
  uint64_t value_local;
  uchar *blind_local;
  secp256k1_pedersen_commitment *commit_local;
  secp256k1_context *ctx_local;
  
  local_190 = 0;
  iVar1 = secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx);
  if (iVar1 == 0) {
    secp256k1_callback_call
              (&ctx->illegal_callback,"secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)")
    ;
    ctx_local._4_4_ = 0;
  }
  else if (commit == (secp256k1_pedersen_commitment *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"commit != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (blind == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"blind != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (gen == (secp256k1_generator *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"gen != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    secp256k1_generator_load((secp256k1_ge *)&rj.infinity,gen);
    secp256k1_scalar_set_b32((secp256k1_scalar *)&ret,blind,&local_18c);
    if (local_18c == 0) {
      secp256k1_pedersen_ecmult
                (&ctx->ecmult_gen_ctx,(secp256k1_gej *)&r.infinity,(secp256k1_scalar *)&ret,value,
                 (secp256k1_ge *)&rj.infinity);
      iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)&r.infinity);
      if (iVar1 == 0) {
        secp256k1_ge_set_gej((secp256k1_ge *)(sec.d + 3),(secp256k1_gej *)&r.infinity);
        secp256k1_pedersen_commitment_save(commit,(secp256k1_ge *)(sec.d + 3));
      }
      local_190 = (uint)(iVar1 == 0);
      secp256k1_gej_clear((secp256k1_gej *)&r.infinity);
      secp256k1_ge_clear((secp256k1_ge *)(sec.d + 3));
    }
    secp256k1_scalar_clear((secp256k1_scalar *)&ret);
    ctx_local._4_4_ = local_190;
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_pedersen_commit(const secp256k1_context* ctx, secp256k1_pedersen_commitment *commit, const unsigned char *blind, uint64_t value, const secp256k1_generator* gen) {
    secp256k1_ge genp;
    secp256k1_gej rj;
    secp256k1_ge r;
    secp256k1_scalar sec;
    int overflow;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(commit != NULL);
    ARG_CHECK(blind != NULL);
    ARG_CHECK(gen != NULL);
    secp256k1_generator_load(&genp, gen);
    secp256k1_scalar_set_b32(&sec, blind, &overflow);
    if (!overflow) {
        secp256k1_pedersen_ecmult(&ctx->ecmult_gen_ctx, &rj, &sec, value, &genp);
        if (!secp256k1_gej_is_infinity(&rj)) {
            secp256k1_ge_set_gej(&r, &rj);
            secp256k1_pedersen_commitment_save(commit, &r);
            ret = 1;
        }
        secp256k1_gej_clear(&rj);
        secp256k1_ge_clear(&r);
    }
    secp256k1_scalar_clear(&sec);
    return ret;
}